

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

string * __thiscall HighFreqPub::getAddress_abi_cxx11_(HighFreqPub *this)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string HighFreqPub::getAddress() const{
    return sockEndpoint;
}